

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorProto::MergeFrom(DescriptorProto *this,DescriptorProto *from)

{
  byte bVar1;
  int iVar2;
  FieldDescriptorProto *pFVar3;
  void **ppvVar4;
  DescriptorProto *from_00;
  EnumDescriptorProto *from_01;
  DescriptorProto_ExtensionRange *from_02;
  uint uVar5;
  LogMessage *other;
  FieldDescriptorProto *pFVar6;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  DescriptorProto_ExtensionRange *this_02;
  string *psVar7;
  MessageOptions *this_03;
  int iVar8;
  MessageOptions *from_03;
  long lVar9;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x8f0);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->field_).super_RepeatedPtrFieldBase,
             (from->field_).super_RepeatedPtrFieldBase.current_size_ +
             (this->field_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->field_).super_RepeatedPtrFieldBase.current_size_) {
    lVar9 = 0;
    do {
      pFVar3 = (FieldDescriptorProto *)(from->field_).super_RepeatedPtrFieldBase.elements_[lVar9];
      iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (this->field_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar4 = (this->field_).super_RepeatedPtrFieldBase.elements_;
        (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pFVar6 = (FieldDescriptorProto *)ppvVar4[iVar2];
      }
      else {
        if (iVar8 == (this->field_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->field_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (this->field_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->field_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        pFVar6 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
        ppvVar4 = (this->field_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
        (this->field_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar4[iVar2] = pFVar6;
      }
      FieldDescriptorProto::MergeFrom(pFVar6,pFVar3);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (from->field_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->extension_).super_RepeatedPtrFieldBase,
             (from->extension_).super_RepeatedPtrFieldBase.current_size_ +
             (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar9 = 0;
    do {
      pFVar3 = (FieldDescriptorProto *)
               (from->extension_).super_RepeatedPtrFieldBase.elements_[lVar9];
      iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar4 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        pFVar6 = (FieldDescriptorProto *)ppvVar4[iVar2];
      }
      else {
        if (iVar8 == (this->extension_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->extension_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->extension_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        pFVar6 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
        ppvVar4 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar4[iVar2] = pFVar6;
      }
      FieldDescriptorProto::MergeFrom(pFVar6,pFVar3);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (from->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->nested_type_).super_RepeatedPtrFieldBase,
             (from->nested_type_).super_RepeatedPtrFieldBase.current_size_ +
             (this->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->nested_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar9 = 0;
    do {
      from_00 = (DescriptorProto *)(from->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar9];
      iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.elements_;
        (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_00 = (DescriptorProto *)ppvVar4[iVar2];
      }
      else {
        if (iVar8 == (this->nested_type_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->nested_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar4 = (this->nested_type_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
        (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar4[iVar2] = this_00;
      }
      MergeFrom(this_00,from_00);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (from->nested_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             (from->enum_type_).super_RepeatedPtrFieldBase.current_size_ +
             (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar9 = 0;
    do {
      from_01 = (EnumDescriptorProto *)
                (from->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar9];
      iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
        (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_01 = (EnumDescriptorProto *)ppvVar4[iVar2];
      }
      else {
        if (iVar8 == (this->enum_type_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        this_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
        ppvVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar4[iVar2] = this_01;
      }
      EnumDescriptorProto::MergeFrom(this_01,from_01);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (from->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->extension_range_).super_RepeatedPtrFieldBase,
             (from->extension_range_).super_RepeatedPtrFieldBase.current_size_ +
             (this->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
    lVar9 = 0;
    do {
      from_02 = (DescriptorProto_ExtensionRange *)
                (from->extension_range_).super_RepeatedPtrFieldBase.elements_[lVar9];
      iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.elements_;
        (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        this_02 = (DescriptorProto_ExtensionRange *)ppvVar4[iVar2];
      }
      else {
        if (iVar8 == (this->extension_range_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->extension_range_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        this_02 = internal::GenericTypeHandler<google::protobuf::DescriptorProto_ExtensionRange>::
                  New();
        ppvVar4 = (this->extension_range_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar4[iVar2] = this_02;
      }
      DescriptorProto_ExtensionRange::MergeFrom(this_02,from_02);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (from->extension_range_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar1 = (byte)from->_has_bits_[0];
  uVar5 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      psVar7 = this->name_;
      if (psVar7 == (string *)&internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)psVar7);
      uVar5 = from->_has_bits_[0];
    }
    if ((uVar5 & 0x40) != 0) {
      *(byte *)this->_has_bits_ = (byte)this->_has_bits_[0] | 0x40;
      this_03 = this->options_;
      if (this_03 == (MessageOptions *)0x0) {
        this_03 = (MessageOptions *)operator_new(0x68);
        MessageOptions::MessageOptions(this_03);
        this->options_ = this_03;
      }
      from_03 = from->options_;
      if (from_03 == (MessageOptions *)0x0) {
        from_03 = *(MessageOptions **)(default_instance_ + 0x90);
      }
      MessageOptions::MergeFrom(this_03,from_03);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void DescriptorProto::MergeFrom(const DescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  field_.MergeFrom(from.field_);
  extension_.MergeFrom(from.extension_);
  nested_type_.MergeFrom(from.nested_type_);
  enum_type_.MergeFrom(from.enum_type_);
  extension_range_.MergeFrom(from.extension_range_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::MessageOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}